

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O1

bool __thiscall
re2::PCRE::PartialMatchFunctor::operator()
          (PartialMatchFunctor *this,StringPiece *text,PCRE *re,Arg *a0,Arg *a1,Arg *a2,Arg *a3,
          Arg *a4,Arg *a5,Arg *a6,Arg *a7,Arg *a8,Arg *a9,Arg *a10,Arg *a11,Arg *a12,Arg *a13,
          Arg *a14,Arg *a15)

{
  bool bVar1;
  int n;
  int consumed;
  Arg *args [16];
  int vec [51];
  
  if (a0 == (Arg *)no_more_args) {
    n = 0;
  }
  else {
    args[0] = a0;
    if (a1 == (Arg *)no_more_args) {
      n = 1;
    }
    else {
      args[1] = a1;
      if (a2 == (Arg *)no_more_args) {
        n = 2;
      }
      else {
        args[2] = a2;
        if (a3 == (Arg *)no_more_args) {
          n = 3;
        }
        else {
          args[3] = a3;
          if (a4 == (Arg *)no_more_args) {
            n = 4;
          }
          else {
            args[4] = a4;
            if (a5 == (Arg *)no_more_args) {
              n = 5;
            }
            else {
              args[5] = a5;
              if (a6 == (Arg *)no_more_args) {
                n = 6;
              }
              else {
                args[6] = a6;
                if (a7 == (Arg *)no_more_args) {
                  n = 7;
                }
                else {
                  args[7] = a7;
                  if (a8 == (Arg *)no_more_args) {
                    n = 8;
                  }
                  else {
                    args[8] = a8;
                    if (a9 == (Arg *)no_more_args) {
                      n = 9;
                    }
                    else {
                      args[9] = a9;
                      if (a10 == (Arg *)no_more_args) {
                        n = 10;
                      }
                      else {
                        args[10] = a10;
                        if (a11 == (Arg *)no_more_args) {
                          n = 0xb;
                        }
                        else {
                          args[0xb] = a11;
                          if (a12 == (Arg *)no_more_args) {
                            n = 0xc;
                          }
                          else {
                            args[0xc] = a12;
                            if (a13 == (Arg *)no_more_args) {
                              n = 0xd;
                            }
                            else {
                              args[0xd] = a13;
                              if (a14 == (Arg *)no_more_args) {
                                n = 0xe;
                              }
                              else {
                                args[0xe] = a14;
                                if (a15 == (Arg *)no_more_args) {
                                  n = 0xf;
                                }
                                else {
                                  args[0xf] = a15;
                                  n = 0x10;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  memset(vec,0,0xcc);
  bVar1 = DoMatchImpl(re,text,UNANCHORED,&consumed,args,n,vec,0x33);
  return bVar1;
}

Assistant:

bool PCRE::PartialMatchFunctor::operator ()(const StringPiece& text,
                                          const PCRE& re,
                                          const Arg& a0,
                                          const Arg& a1,
                                          const Arg& a2,
                                          const Arg& a3,
                                          const Arg& a4,
                                          const Arg& a5,
                                          const Arg& a6,
                                          const Arg& a7,
                                          const Arg& a8,
                                          const Arg& a9,
                                          const Arg& a10,
                                          const Arg& a11,
                                          const Arg& a12,
                                          const Arg& a13,
                                          const Arg& a14,
                                          const Arg& a15) const {
  const Arg* args[kMaxArgs];
  int n = 0;
  if (&a0 == &no_more_args)  goto done; args[n++] = &a0;
  if (&a1 == &no_more_args)  goto done; args[n++] = &a1;
  if (&a2 == &no_more_args)  goto done; args[n++] = &a2;
  if (&a3 == &no_more_args)  goto done; args[n++] = &a3;
  if (&a4 == &no_more_args)  goto done; args[n++] = &a4;
  if (&a5 == &no_more_args)  goto done; args[n++] = &a5;
  if (&a6 == &no_more_args)  goto done; args[n++] = &a6;
  if (&a7 == &no_more_args)  goto done; args[n++] = &a7;
  if (&a8 == &no_more_args)  goto done; args[n++] = &a8;
  if (&a9 == &no_more_args)  goto done; args[n++] = &a9;
  if (&a10 == &no_more_args) goto done; args[n++] = &a10;
  if (&a11 == &no_more_args) goto done; args[n++] = &a11;
  if (&a12 == &no_more_args) goto done; args[n++] = &a12;
  if (&a13 == &no_more_args) goto done; args[n++] = &a13;
  if (&a14 == &no_more_args) goto done; args[n++] = &a14;
  if (&a15 == &no_more_args) goto done; args[n++] = &a15;
done:

  int consumed;
  int vec[kVecSize] = {};
  return re.DoMatchImpl(text, UNANCHORED, &consumed, args, n, vec, kVecSize);
}